

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.hh
# Opt level: O2

size_t OpenMesh::IO::restore<OpenMesh::IO::OMFormat::Chunk::PropertyName>
                 (istream *_is,PropertyName *_pn,bool _swap)

{
  size_t sVar1;
  undefined7 in_register_00000011;
  char local_158 [8];
  char buf [256];
  string local_50;
  ulong local_30;
  size_t size;
  
  restore<unsigned_long>(_is,&local_30,0,CONCAT71(in_register_00000011,_swap) & 0xffffffff);
  if (local_30 < 0x101) {
    if (local_30 == 0) {
      sVar1 = 1;
    }
    else {
      std::istream::read((char *)_is,(long)local_158);
      local_158[local_30] = '\0';
      std::__cxx11::string::resize((ulong)_pn);
      std::__cxx11::string::string((string *)&local_50,local_158,(allocator *)((long)&size + 7));
      OMFormat::Chunk::PropertyName::operator=(_pn,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      sVar1 = local_30 + 1;
    }
    return sVar1;
  }
  __assert_fail("OMFormat::Chunk::PropertyName::is_valid( size )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./OpenMesh/Core/IO/OMFormat.hh"
                ,0x2c7,
                "size_t OpenMesh::IO::restore(std::istream &, OMFormat::Chunk::PropertyName &, bool)"
               );
}

Assistant:

inline
  size_t restore( std::istream& _is, OMFormat::Chunk::PropertyName& _pn,
		  bool _swap )
  {
    size_t size;

    restore( _is, size, OMFormat::Chunk::Integer_8, _swap); // 1 byte

    assert( OMFormat::Chunk::PropertyName::is_valid( size ) );

    if ( size > 0 )
    {
      char buf[256];
      _is.read( buf, size ); // size bytes
      buf[size] = '\0';
      _pn.resize(size);
      _pn = buf;
    }
    return size+1;
  }